

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LR.cpp
# Opt level: O1

void __thiscall lr_grammar::GrammarLR::get_tow_char_index(GrammarLR *this)

{
  ulong uVar1;
  pointer pEVar2;
  pointer *ppiVar3;
  ulong uVar4;
  iterator __position;
  vector<int,std::allocator<int>> *this_00;
  vector<int,_std::allocator<int>_> t;
  int local_6c;
  value_type local_68;
  pointer *local_48;
  vector<int,std::allocator<int>> *local_40;
  pointer *local_38;
  
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_6c = 0;
  pEVar2 = (this->elements).
           super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl
           .super__Vector_impl_data._M_start;
  if ((this->elements).
      super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>._M_impl.
      super__Vector_impl_data._M_finish != pEVar2) {
    local_38 = &(this->not_finally_charIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    local_40 = (vector<int,std::allocator<int>> *)&this->not_finally_charIndex;
    local_48 = &(this->finally_charIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
    uVar1 = 0;
    do {
      if (pEVar2[uVar1].super_Elem.is_finally == true) {
        __position._M_current =
             (this->finally_charIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        ppiVar3 = local_48;
        this_00 = (vector<int,std::allocator<int>> *)&this->finally_charIndex;
        if (__position._M_current ==
            (this->finally_charIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0010ae7a;
LAB_0010ae5b:
        *__position._M_current = (int)uVar1;
        *ppiVar3 = __position._M_current + 1;
      }
      else {
        __position._M_current =
             (this->not_finally_charIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        ppiVar3 = local_38;
        this_00 = local_40;
        if (__position._M_current !=
            (this->not_finally_charIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) goto LAB_0010ae5b;
LAB_0010ae7a:
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (this_00,__position,&local_6c);
      }
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(&this->first,&local_68);
      std::
      vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
      ::push_back(&this->follow,&local_68);
      uVar1 = (long)local_6c + 1;
      local_6c = (int)uVar1;
      pEVar2 = (this->elements).
               super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar4 = ((long)(this->elements).
                     super__Vector_base<lr_grammar::ElemRight,_std::allocator<lr_grammar::ElemRight>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pEVar2 >> 3) *
              -0x71c71c71c71c71c7;
    } while (uVar1 <= uVar4 && uVar4 - uVar1 != 0);
  }
  if (local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GrammarLR::get_tow_char_index(){
    vector<int> t;
    t.clear();

    for (int i = 0; i < elements.size(); i++){
        if (elements[i].is_finally){
            finally_charIndex.push_back(i);
        }
        else
        {
            not_finally_charIndex.push_back(i);
        }
        first.push_back(t);
        follow.push_back(t);

    }

}